

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O3

void rcg::convYCbCr422toQuadRGB(uint8_t *rgb,uint8_t *row,int i)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  uint8_t uVar6;
  int iVar7;
  bool bVar8;
  uint *puVar9;
  uint local_38;
  uint local_34;
  
  uVar5 = 0;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    uVar5 = uVar5 | (long)(int)(i * 2 & 0xfffffff8);
    local_34 = (uint)row[uVar5];
    local_38 = (uint)row[uVar5 + 2];
    bVar1 = row[uVar5 + 1];
    bVar2 = row[uVar5 + 3];
    puVar9 = &local_34;
    bVar3 = true;
    do {
      bVar8 = bVar3;
      iVar7 = *puVar9 + (((uint)bVar2 * 0x5a + 0x1320 >> 6) - 0x100);
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      uVar6 = (uint8_t)iVar7;
      if (0xfe < iVar7) {
        uVar6 = 0xff;
      }
      *rgb = uVar6;
      iVar7 = *puVar9 + (((uint)bVar2 * -0x2e + (uint)bVar1 * -0x16 + 0x6220 >> 6) - 0x100);
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      uVar6 = (uint8_t)iVar7;
      if (0xfe < iVar7) {
        uVar6 = 0xff;
      }
      rgb[1] = uVar6;
      iVar7 = *puVar9 + (((uint)bVar1 * 0x71 + 0x7a0 >> 6) - 0x100);
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      uVar6 = (uint8_t)iVar7;
      if (0xfe < iVar7) {
        uVar6 = 0xff;
      }
      rgb[2] = uVar6;
      rgb = rgb + 3;
      puVar9 = &local_38;
      bVar3 = false;
    } while (bVar8);
    uVar5 = 4;
    bVar3 = false;
  } while (bVar4);
  return;
}

Assistant:

void convYCbCr422toQuadRGB(uint8_t rgb[12], const uint8_t *row, int i)
{
  i=(i>>2)*8;

  for (int k=0; k<8; k+=4)
  {
    const int Y[2]={row[i+k], row[i+2+k]};
    const int Cb=static_cast<int>(row[i+1+k])-128;
    const int Cr=static_cast<int>(row[i+3+k])-128;

    // conversion of YCbCr into RGB with correct rounding
    const int rc=((90*Cr+16384+32)>>6)-256;
    const int gc=((-22*Cb-46*Cr+16384+32)>>6)-256;
    const int bc=((113*Cb+16384+32)>>6)-256;

    for (int j=0; j<2; j++)
    {
      *rgb++=clamp8(Y[j]+rc);
      *rgb++=clamp8(Y[j]+gc);
      *rgb++=clamp8(Y[j]+bc);
    }
  }
}